

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

string * __thiscall
t_ocaml_generator::render_ocaml_type_abi_cxx11_
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type)

{
  long lVar1;
  t_type *type_00;
  int iVar2;
  t_type *ttype;
  undefined4 extraout_var;
  long *plVar3;
  undefined8 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  size_type *psVar6;
  long *plVar7;
  ulong *puVar8;
  char *pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  ttype = t_type::get_true_type(type);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar2 != '\0') {
    switch(*(undefined4 *)&ttype[1].super_t_doc._vptr_t_doc) {
    case 0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "unit";
      pcVar9 = "";
      break;
    case 1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "string";
      pcVar9 = "";
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "bool";
      pcVar9 = "";
      break;
    case 3:
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "int";
      pcVar9 = "";
      break;
    case 5:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Int32.t";
      pcVar9 = "";
      break;
    case 6:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Int64.t";
      pcVar9 = "";
      break;
    case 7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "float";
      pcVar9 = "";
      break;
    default:
switchD_002d8fc3_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar2));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar9)
    ;
    return __return_storage_ptr__;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
  if ((char)iVar2 != '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,lVar1,((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
    paVar5 = local_a8;
    iVar2 = toupper((int)local_a8->_M_local_buf[0]);
    paVar5->_M_local_buf[0] = (char)iVar2;
    if (local_a8 == &local_98) {
      local_e8.field_2._8_8_ = local_98._8_8_;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)local_a8;
    }
    local_e8.field_2._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
    local_e8.field_2._M_local_buf[0] = local_98._M_local_buf[0];
    local_e8._M_string_length = local_a0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_a8 = &local_98;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    paVar12 = local_a8;
    if (local_a8 == &local_98) {
      return __return_storage_ptr__;
    }
    goto LAB_002d9108;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar2 != '\0') ||
     (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar2 != '\0')) {
    type_name_abi_cxx11_(__return_storage_ptr__,this,ttype);
    return __return_storage_ptr__;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto switchD_002d8fc3_default;
      render_ocaml_type_abi_cxx11_(&local_e8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      std::operator+(__return_storage_ptr__,&local_e8," list");
      paVar5 = &local_e8.field_2;
    }
    else {
      render_ocaml_type_abi_cxx11_(&local_c8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      std::operator+(&local_e8,"(",&local_c8);
      std::operator+(__return_storage_ptr__,&local_e8,",bool) Hashtbl.t");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      paVar5 = &local_c8.field_2;
    }
  }
  else {
    type_00 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
    render_ocaml_type_abi_cxx11_(&local_48,this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x3a1f75);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_58 = *plVar7;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar7;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    paVar5 = &local_c8.field_2;
    puVar8 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_c8.field_2._M_allocated_capacity = *puVar8;
      local_c8.field_2._8_8_ = plVar3[3];
      local_c8._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *puVar8;
      local_c8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_c8._M_string_length = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    render_ocaml_type_abi_cxx11_(&local_88,this,type_00);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar5) {
      uVar11 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_88._M_string_length + local_c8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar11 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_88._M_string_length + local_c8._M_string_length) goto LAB_002d93ae;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_88,0,(char *)0x0,(ulong)local_c8._M_dataplus._M_p);
    }
    else {
LAB_002d93ae:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88._M_dataplus._M_p);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8.field_2._8_8_ = puVar4[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_e8._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(char *)psVar6 = '\0';
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar5) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    paVar5 = &local_48.field_2;
  }
  paVar12 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(paVar5->_M_local_buf + -0x10);
  if (paVar12 == paVar5) {
    return __return_storage_ptr__;
  }
LAB_002d9108:
  operator_delete(paVar12);
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::render_ocaml_type(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "unit";
    case t_base_type::TYPE_STRING:
      return "string";
    case t_base_type::TYPE_BOOL:
      return "bool";
    case t_base_type::TYPE_I8:
      return "int";
    case t_base_type::TYPE_I16:
      return "int";
    case t_base_type::TYPE_I32:
      return "Int32.t";
    case t_base_type::TYPE_I64:
      return "Int64.t";
    case t_base_type::TYPE_DOUBLE:
      return "float";
    }
  } else if (type->is_enum()) {
    return capitalize(((t_enum*)type)->get_name()) + ".t";
  } else if (type->is_struct() || type->is_xception()) {
    return type_name((t_struct*)type);
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    return "(" + render_ocaml_type(ktype) + "," + render_ocaml_type(vtype) + ") Hashtbl.t";
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    return "(" + render_ocaml_type(etype) + ",bool) Hashtbl.t";
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    return render_ocaml_type(etype) + " list";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}